

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::SceneCombiner::CopyScene(aiScene **_dest,aiScene *src,bool allocate)

{
  ai_uint aVar1;
  aiMetadata *rhs;
  aiScene *this;
  aiMetadata *this_00;
  undefined4 uVar2;
  
  if (src != (aiScene *)0x0 && _dest != (aiScene **)0x0) {
    if (allocate) {
      this = (aiScene *)operator_new(0x80);
      aiScene::aiScene(this);
      *_dest = this;
    }
    else {
      this = *_dest;
    }
    rhs = src->mMetaData;
    if (rhs != (aiMetadata *)0x0) {
      this_00 = (aiMetadata *)operator_new(0x18);
      aiMetadata::aiMetadata(this_00,rhs);
      this->mMetaData = this_00;
    }
    aVar1 = src->mNumAnimations;
    this->mNumAnimations = aVar1;
    CopyPtrArray<aiAnimation>(&this->mAnimations,src->mAnimations,aVar1);
    aVar1 = src->mNumTextures;
    this->mNumTextures = aVar1;
    CopyPtrArray<aiTexture>(&this->mTextures,src->mTextures,aVar1);
    aVar1 = src->mNumMaterials;
    this->mNumMaterials = aVar1;
    CopyPtrArray<aiMaterial>(&this->mMaterials,src->mMaterials,aVar1);
    aVar1 = src->mNumLights;
    this->mNumLights = aVar1;
    CopyPtrArray<aiLight>(&this->mLights,src->mLights,aVar1);
    aVar1 = src->mNumCameras;
    this->mNumCameras = aVar1;
    CopyPtrArray<aiCamera>(&this->mCameras,src->mCameras,aVar1);
    aVar1 = src->mNumMeshes;
    this->mNumMeshes = aVar1;
    CopyPtrArray<aiMesh>(&this->mMeshes,src->mMeshes,aVar1);
    Copy(&this->mRootNode,src->mRootNode);
    this->mFlags = src->mFlags;
    if (this->mPrivate != (void *)0x0) {
      if (src->mPrivate == (void *)0x0) {
        uVar2 = 0;
      }
      else {
        uVar2 = *(undefined4 *)((long)src->mPrivate + 8);
      }
      *(undefined4 *)((long)this->mPrivate + 8) = uVar2;
    }
  }
  return;
}

Assistant:

void SceneCombiner::CopyScene(aiScene** _dest,const aiScene* src,bool allocate) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    if (allocate) {
        *_dest = new aiScene();
    }
    aiScene* dest = *_dest;
    ai_assert(nullptr != dest);

    // copy metadata
    if ( nullptr != src->mMetaData ) {
        dest->mMetaData = new aiMetadata( *src->mMetaData );
    }

    // copy animations
    dest->mNumAnimations = src->mNumAnimations;
    CopyPtrArray(dest->mAnimations,src->mAnimations,
        dest->mNumAnimations);

    // copy textures
    dest->mNumTextures = src->mNumTextures;
    CopyPtrArray(dest->mTextures,src->mTextures,
        dest->mNumTextures);

    // copy materials
    dest->mNumMaterials = src->mNumMaterials;
    CopyPtrArray(dest->mMaterials,src->mMaterials,
        dest->mNumMaterials);

    // copy lights
    dest->mNumLights = src->mNumLights;
    CopyPtrArray(dest->mLights,src->mLights,
        dest->mNumLights);

    // copy cameras
    dest->mNumCameras = src->mNumCameras;
    CopyPtrArray(dest->mCameras,src->mCameras,
        dest->mNumCameras);

    // copy meshes
    dest->mNumMeshes = src->mNumMeshes;
    CopyPtrArray(dest->mMeshes,src->mMeshes,
        dest->mNumMeshes);

    // now - copy the root node of the scene (deep copy, too)
    Copy( &dest->mRootNode, src->mRootNode);

    // and keep the flags ...
    dest->mFlags = src->mFlags;

    // source private data might be NULL if the scene is user-allocated (i.e. for use with the export API)
    if (dest->mPrivate != NULL) {
        ScenePriv(dest)->mPPStepsApplied = ScenePriv(src) ? ScenePriv(src)->mPPStepsApplied : 0;
    }
}